

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

int lj_record_next(jit_State *J,RecordIndex *ix)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  TRef TVar4;
  TRef TVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  IRRef1 IVar9;
  uint uVar10;
  
  uVar8 = (ix->tabv).u64 & 0x7fffffffffff;
  uVar3 = (ix->keyv).u32.lo;
  uVar7 = (ulong)uVar3;
  uVar10 = *(uint *)(uVar8 + 0x30);
  if (uVar3 < uVar10) {
    do {
      lVar1 = *(long *)(*(long *)(uVar8 + 0x10) + uVar7 * 8);
      if (lVar1 != -1) {
        uVar10 = 0xe0e;
        if (0xfffffffffffffff1 < (ulong)(lVar1 >> 0x2f)) {
          uVar10 = ~(uint)(lVar1 >> 0x2f) << 8 | 0xe;
        }
        goto LAB_00131c70;
      }
      uVar7 = uVar7 + 1;
      uVar3 = uVar10;
    } while (uVar10 != uVar7);
  }
  uVar3 = uVar3 - uVar10;
  uVar10 = 0;
  if (uVar3 <= *(uint *)(uVar8 + 0x34)) {
    do {
      lVar1 = *(long *)(*(long *)(uVar8 + 0x28) + (ulong)uVar3 * 0x18);
      if (lVar1 != -1) {
        lVar2 = *(long *)(*(long *)(uVar8 + 0x28) + (ulong)uVar3 * 0x18 + 8);
        uVar3 = 0xe;
        if (0xfffffffffffffff1 < (ulong)(lVar2 >> 0x2f)) {
          uVar3 = ~(uint)(lVar2 >> 0x2f);
        }
        uVar10 = 0xe00;
        if (0xfffffffffffffff1 < (ulong)(lVar1 >> 0x2f)) {
          uVar10 = ~(uint)(lVar1 >> 0x2f) << 8;
        }
        uVar10 = uVar10 | uVar3;
        break;
      }
      uVar3 = uVar3 + 1;
      uVar10 = 0;
    } while (uVar3 <= *(uint *)(uVar8 + 0x34));
  }
LAB_00131c70:
  uVar3 = uVar10 & 0xff;
  TVar4 = lj_ir_call(J,IRCALL_lj_vm_next,(ulong)ix->tab,(ulong)ix->key);
  IVar9 = (IRRef1)TVar4;
  if ((ix->mobj != 0) || (uVar3 == 0)) {
    (J->fold).ins.field_0.ot = 0x1013;
    (J->fold).ins.field_0.op1 = IVar9;
    (J->fold).ins.field_0.op2 = IVar9;
    TVar4 = lj_opt_fold(J);
    if (ix->mobj == 0) {
      TVar5 = lj_ir_kint(J,-1);
      (J->fold).ins.field_0.ot = 0x993;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
      lj_opt_fold(J);
    }
    ix->mobj = TVar4;
  }
  (J->fold).ins.field_0.ot = (ushort)uVar3 | 0x4880;
  (J->fold).ins.field_0.op1 = IVar9;
  (J->fold).ins.field_0.op2 = 1;
  TVar5 = lj_opt_fold(J);
  TVar4 = uVar3 * 0xffffff + 0x7fff;
  if (2 < uVar3) {
    TVar4 = TVar5;
  }
  ix->key = TVar4;
  iVar6 = 1;
  TVar4 = 0x7fff;
  if ((uVar3 != 0) && (ix->idxchain == 0)) {
    (J->fold).ins.field_0.ot = (ushort)(uVar10 >> 8) | 0x4880;
    (J->fold).ins.field_0.op1 = IVar9;
    (J->fold).ins.field_0.op2 = 0;
    TVar5 = lj_opt_fold(J);
    TVar4 = (uVar10 >> 8) * 0xffffff + 0x7fff;
    if (0x2ff < uVar10) {
      TVar4 = TVar5;
    }
    iVar6 = 2;
  }
  ix->val = TVar4;
  return iVar6;
}

Assistant:

int lj_record_next(jit_State *J, RecordIndex *ix)
{
  IRType t, tkey, tval;
  TRef trvk;
  t = rec_next_types(tabV(&ix->tabv), ix->keyv.u32.lo);
  tkey = (t & 0xff); tval = (t >> 8);
  trvk = lj_ir_call(J, IRCALL_lj_vm_next, ix->tab, ix->key);
  if (ix->mobj || tkey == IRT_NIL) {
    TRef idx = emitir(IRTI(IR_HIOP), trvk, trvk);
    /* Always check for invalid key from next() for nil result. */
    if (!ix->mobj) emitir(IRTGI(IR_NE), idx, lj_ir_kint(J, -1));
    ix->mobj = idx;
  }
  ix->key = lj_record_vload(J, trvk, 1, tkey);
  if (tkey == IRT_NIL || ix->idxchain) {  /* Omit value type check. */
    ix->val = TREF_NIL;
    return 1;
  } else {  /* Need value. */
    ix->val = lj_record_vload(J, trvk, 0, tval);
    return 2;
  }
}